

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

STBase * __thiscall jbcoin::STObject::peekAtField(STObject *this,SField *field)

{
  int offset;
  STBase *pSVar1;
  int index;
  SField *field_local;
  STObject *this_local;
  
  offset = getFieldIndex(this,field);
  if (offset == -1) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  pSVar1 = peekAtIndex(this,offset);
  return pSVar1;
}

Assistant:

const STBase& STObject::peekAtField (SField const& field) const
{
    int index = getFieldIndex (field);

    if (index == -1)
        Throw<std::runtime_error> ("Field not found");

    return peekAtIndex (index);
}